

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O1

int IDABBDPrecInitB(void *ida_mem,int which,sunindextype NlocalB,sunindextype mudqB,
                   sunindextype mldqB,sunindextype mukeepB,sunindextype mlkeepB,
                   sunrealtype dq_rel_yyB,IDABBDLocalFnB glocalB,IDABBDCommFnB gcommB)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  int *piVar4;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar3 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    iVar1 = 0x2eb;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAAdjInit.";
    iVar3 = -0x65;
    error_code = -0x65;
    iVar1 = 0x2f4;
  }
  else if (which < *(int *)(*(long *)((long)ida_mem + 0x840) + 0x38)) {
    for (piVar4 = *(int **)(*(long *)((long)ida_mem + 0x840) + 0x30);
        (piVar4 != (int *)0x0 && (*piVar4 != which)); piVar4 = *(int **)(piVar4 + 0x20)) {
    }
    iVar1 = IDABBDPrecInit(*(void **)(piVar4 + 4),NlocalB,mudqB,mldqB,mukeepB,mlkeepB,dq_rel_yyB,
                           IDAAglocal,IDAAgcomm);
    if (iVar1 != 0) {
      return iVar1;
    }
    puVar2 = (undefined8 *)malloc(0x10);
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = glocalB;
      puVar2[1] = gcommB;
      *(undefined8 **)(piVar4 + 0x16) = puVar2;
      *(code **)(piVar4 + 0x18) = IDABBDPrecFreeB;
      return 0;
    }
    msgfmt = "A memory request failed.";
    iVar3 = -4;
    error_code = -4;
    iVar1 = 0x318;
  }
  else {
    msgfmt = "Illegal value for which.";
    iVar3 = -3;
    error_code = -3;
    iVar1 = 0x2fd;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDABBDPrecInitB",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_bbdpre.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int IDABBDPrecInitB(void* ida_mem, int which, sunindextype NlocalB,
                    sunindextype mudqB, sunindextype mldqB, sunindextype mukeepB,
                    sunindextype mlkeepB, sunrealtype dq_rel_yyB,
                    IDABBDLocalFnB glocalB, IDABBDCommFnB gcommB)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  IDABBDPrecDataB idabbdB_mem;
  void* ida_memB;
  int flag;

  /* Check if ida_mem is all right. */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDALS_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_WHICH);
    return (IDALS_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  /* ida_mem corresponding to 'which' problem. */
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* Initialize the BBD preconditioner for this backward problem. */
  flag = IDABBDPrecInit(ida_memB, NlocalB, mudqB, mldqB, mukeepB, mlkeepB,
                        dq_rel_yyB, IDAAglocal, IDAAgcomm);
  if (flag != IDA_SUCCESS) { return (flag); }

  /* Allocate memory for IDABBDPrecDataB to store the user-provided
     functions which will be called from the wrappers */
  idabbdB_mem = NULL;
  idabbdB_mem = (IDABBDPrecDataB)malloc(sizeof(*idabbdB_mem));
  if (idabbdB_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* set pointers to user-provided functions */
  idabbdB_mem->glocalB = glocalB;
  idabbdB_mem->gcommB  = gcommB;

  /* Attach pmem and pfree */
  IDAB_mem->ida_pmem  = idabbdB_mem;
  IDAB_mem->ida_pfree = IDABBDPrecFreeB;

  return (IDALS_SUCCESS);
}